

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O1

int sys_run_scheduler(char *externalschedlibname,char *sys_extraflagsstring)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  char **ppcVar4;
  char *pcVar5;
  stat statbuf;
  char filename [1000];
  stat sStack_4a8;
  char local_418 [1000];
  
  pcVar5 = ".l_amd64";
  ppcVar4 = sys_dllextent;
  do {
    ppcVar4 = ppcVar4 + 1;
    snprintf(local_418,1000,"%s%s",externalschedlibname,pcVar5);
    sys_bashfilename(local_418,local_418);
    iVar1 = stat(local_418,&sStack_4a8);
    if (iVar1 == 0) break;
    pcVar5 = *ppcVar4;
  } while (pcVar5 != (char *)0x0);
  lVar2 = dlopen(local_418,0x102);
  if (lVar2 == 0) {
    sys_run_scheduler_cold_1();
    iVar1 = 1;
  }
  else {
    pcVar3 = (code *)dlsym(lVar2,"pd_extern_sched");
    if (pcVar3 == (code *)0x0) {
      iVar1 = 0;
      fprintf(_stderr,"%s: couldn\'t find pd_extern_sched() or main()\n",local_418);
    }
    else {
      iVar1 = (*pcVar3)(sys_extraflagsstring);
    }
  }
  return iVar1;
}

Assistant:

int sys_run_scheduler(const char *externalschedlibname,
    const char *sys_extraflagsstring)
{
    typedef int (*t_externalschedlibmain)(const char *);
    t_externalschedlibmain externalmainfunc;
    char filename[MAXPDSTRING];
    const char**dllextent;
    for(dllextent=sys_dllextent; *dllextent; dllextent++)
    {
        struct stat statbuf;
        snprintf(filename, sizeof(filename), "%s%s", externalschedlibname,
            *dllextent);
        sys_bashfilename(filename, filename);
        if(!stat(filename, &statbuf))
            break;
    }

#ifdef _WIN32
    {
        HINSTANCE ntdll = LoadLibrary(filename);
        if (!ntdll)
        {
            fprintf(stderr, "%s: couldn't load external scheduler\n", filename);
            pd_error(0, "%s: couldn't load external scheduler", filename);
            return (1);
        }
        externalmainfunc =
            (t_externalschedlibmain)GetProcAddress(ntdll, "pd_extern_sched");
        if (!externalmainfunc)
            externalmainfunc =
                (t_externalschedlibmain)GetProcAddress(ntdll, "main");
    }
#elif defined HAVE_LIBDL
    {
        void *dlobj;
        dlobj = dlopen(filename, RTLD_NOW | RTLD_GLOBAL);
        if (!dlobj)
        {
            pd_error(0, "%s: %s", filename, dlerror());
            fprintf(stderr, "dlopen failed for %s: %s\n", filename, dlerror());
            return (1);
        }
        externalmainfunc = (t_externalschedlibmain)dlsym(dlobj,
            "pd_extern_sched");
    }
#else
    return (0);
#endif
    if (externalmainfunc)
        return((*externalmainfunc)(sys_extraflagsstring));
    else
    {
        fprintf(stderr, "%s: couldn't find pd_extern_sched() or main()\n",
            filename);
        return (0);
    }
}